

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O1

void set_filename(char *c)

{
  if (filename != (char *)0x0) {
    free(filename);
  }
  if (c == (char *)0x0) {
    filename = (char *)0x0;
  }
  else {
    filename = strdup(c);
  }
  if ((filename != (char *)0x0) && (batch_mode == 0)) {
    update_history(filename);
  }
  set_modflag(modflag);
  return;
}

Assistant:

void set_filename(const char *c) {
  if (filename) free((void *)filename);
  filename = c ? strdup(c) : NULL;

  if (filename && !batch_mode)
    update_history(filename);

  set_modflag(modflag);
}